

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::InternalSerializeMapEntry
                    (FieldDescriptor *field,MapKey *key,MapValueConstRef *value,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int field_number;
  Descriptor *pDVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  size_t sVar2;
  size_t sVar3;
  uint8_t *puVar4;
  size_t size;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MapValueConstRef *value_local;
  MapKey *key_local;
  FieldDescriptor *field_local;
  
  pDVar1 = FieldDescriptor::message_type(field);
  field_00 = Descriptor::field(pDVar1,0);
  pDVar1 = FieldDescriptor::message_type(field);
  field_01 = Descriptor::field(pDVar1,1);
  sVar2 = MapKeyDataOnlyByteSize(field_00,key);
  sVar3 = MapValueRefDataOnlyByteSize(field_01,value);
  puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  field_number = FieldDescriptor::number(field);
  puVar4 = WireFormatLite::WriteTagToArray(field_number,WIRETYPE_LENGTH_DELIMITED,puVar4);
  puVar4 = io::CodedOutputStream::WriteVarint32ToArray((int)sVar3 + (int)sVar2 + 2,puVar4);
  puVar4 = SerializeMapKeyWithCachedSizes(field_00,key,puVar4,stream);
  puVar4 = SerializeMapValueRefWithCachedSizes(field_01,value,puVar4,stream);
  return puVar4;
}

Assistant:

static uint8_t* InternalSerializeMapEntry(const FieldDescriptor* field,
                                          const MapKey& key,
                                          const MapValueConstRef& value,
                                          uint8_t* target,
                                          io::EpsCopyOutputStream* stream) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  target = stream->EnsureSpace(target);
  target = WireFormatLite::WriteTagToArray(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(size, target);
  target = SerializeMapKeyWithCachedSizes(key_field, key, target, stream);
  target =
      SerializeMapValueRefWithCachedSizes(value_field, value, target, stream);
  return target;
}